

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# procs.cpp
# Opt level: O1

void chai_procs(ChaiScript *chai)

{
  Proxy_Function_Base *pPVar1;
  Dispatch_Engine *this;
  initializer_list<chaiscript::Type_Info> __l;
  initializer_list<chaiscript::Type_Info> __l_00;
  allocator_type local_91;
  vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_> local_90;
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  pointer_____offset_0x10___ *local_58;
  undefined4 local_50;
  pointer_____offset_0x10___ *local_48;
  pointer_____offset_0x10___ *local_40;
  undefined4 local_38;
  Proxy_Function local_30;
  
  pPVar1 = (Proxy_Function_Base *)operator_new(0x28);
  local_78._0_8_ = &std::shared_ptr<henson::ProcMap>::typeinfo;
  local_78._8_8_ = &henson::ProcMap::typeinfo;
  local_68._0_4_ = 0;
  __l._M_len = 1;
  __l._M_array = (iterator)local_78;
  std::vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>::vector
            (&local_90,__l,&local_91);
  chaiscript::dispatch::Proxy_Function_Impl_Base::Proxy_Function_Impl_Base
            ((Proxy_Function_Impl_Base *)pPVar1,&local_90);
  if (local_90.super__Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_90.
                    super__Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_90.
                          super__Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_90.
                          super__Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  pPVar1->_vptr_Proxy_Function_Base = (_func_int **)&PTR__Proxy_Function_Base_00316d90;
  local_30.super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = pPVar1;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<chaiscript::dispatch::Proxy_Function_Base*>
            (&local_30.
              super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount,pPVar1);
  local_78._0_8_ = (type_info *)local_68;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"ProcMap","");
  this = &chai->m_engine;
  chaiscript::detail::Dispatch_Engine::validate_object_name(this,(string *)local_78);
  chaiscript::detail::Dispatch_Engine::add_function(this,&local_30,(string *)local_78);
  if ((type_info *)local_78._0_8_ != (type_info *)local_68) {
    operator_delete((void *)local_78._0_8_,CONCAT44(local_68._4_4_,local_68._0_4_) + 1);
  }
  if (local_30.
      super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_30.
               super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  chaiscript::fun<std::__cxx11::string,henson::ProcMap>((offset_in_ProcMap_to_subr)&local_90);
  local_78._0_8_ = (type_info *)local_68;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"group","");
  chaiscript::detail::Dispatch_Engine::validate_object_name(this,(string *)local_78);
  chaiscript::detail::Dispatch_Engine::add_function
            (this,(Proxy_Function *)&local_90,(string *)local_78);
  if ((type_info *)local_78._0_8_ != (type_info *)local_68) {
    operator_delete((void *)local_78._0_8_,CONCAT44(local_68._4_4_,local_68._0_4_) + 1);
  }
  if (local_90.super__Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>.
      _M_impl.super__Vector_impl_data._M_finish != (pointer)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_90.
               super__Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>.
               _M_impl.super__Vector_impl_data._M_finish);
  }
  chaiscript::fun<int,henson::ProcMap>((offset_in_ProcMap_to_subr)&local_90);
  local_78._0_8_ = (type_info *)local_68;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"color","");
  chaiscript::detail::Dispatch_Engine::validate_object_name(this,(string *)local_78);
  chaiscript::detail::Dispatch_Engine::add_function
            (this,(Proxy_Function *)&local_90,(string *)local_78);
  if ((type_info *)local_78._0_8_ != (type_info *)local_68) {
    operator_delete((void *)local_78._0_8_,CONCAT44(local_68._4_4_,local_68._0_4_) + 1);
  }
  if (local_90.super__Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>.
      _M_impl.super__Vector_impl_data._M_finish != (pointer)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_90.
               super__Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>.
               _M_impl.super__Vector_impl_data._M_finish);
  }
  chaiscript::fun<int,henson::ProcMap>((offset_in_ProcMap_to_subr)&local_90);
  local_78._0_8_ = (type_info *)local_68;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"world_rank","");
  chaiscript::detail::Dispatch_Engine::validate_object_name(this,(string *)local_78);
  chaiscript::detail::Dispatch_Engine::add_function
            (this,(Proxy_Function *)&local_90,(string *)local_78);
  if ((type_info *)local_78._0_8_ != (type_info *)local_68) {
    operator_delete((void *)local_78._0_8_,CONCAT44(local_68._4_4_,local_68._0_4_) + 1);
  }
  if (local_90.super__Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>.
      _M_impl.super__Vector_impl_data._M_finish != (pointer)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_90.
               super__Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>.
               _M_impl.super__Vector_impl_data._M_finish);
  }
  chaiscript::fun<int,henson::ProcMap>((offset_in_ProcMap_to_subr)&local_90);
  local_78._0_8_ = (type_info *)local_68;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"local_rank","");
  chaiscript::detail::Dispatch_Engine::validate_object_name(this,(string *)local_78);
  chaiscript::detail::Dispatch_Engine::add_function
            (this,(Proxy_Function *)&local_90,(string *)local_78);
  if ((type_info *)local_78._0_8_ != (type_info *)local_68) {
    operator_delete((void *)local_78._0_8_,CONCAT44(local_68._4_4_,local_68._0_4_) + 1);
  }
  if (local_90.super__Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>.
      _M_impl.super__Vector_impl_data._M_finish != (pointer)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_90.
               super__Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>.
               _M_impl.super__Vector_impl_data._M_finish);
  }
  pPVar1 = (Proxy_Function_Base *)operator_new(0x28);
  local_78._0_8_ = &void::typeinfo;
  local_78._8_8_ = &void::typeinfo;
  local_68._0_4_ = 8;
  local_68._8_8_ = &henson::ProcMap*::typeinfo;
  local_58 = &henson::ProcMap::typeinfo;
  local_50 = 4;
  local_48 = &std::__cxx11::string::typeinfo;
  local_40 = &std::__cxx11::string::typeinfo;
  local_38 = 0;
  __l_00._M_len = 3;
  __l_00._M_array = (iterator)local_78;
  std::vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>::vector
            (&local_90,__l_00,&local_91);
  chaiscript::dispatch::Proxy_Function_Impl_Base::Proxy_Function_Impl_Base
            ((Proxy_Function_Impl_Base *)pPVar1,&local_90);
  if (local_90.super__Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_90.
                    super__Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_90.
                          super__Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_90.
                          super__Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  pPVar1->_vptr_Proxy_Function_Base = (_func_int **)&PTR__Proxy_Function_Base_00316e08;
  local_30.super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = pPVar1;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<chaiscript::dispatch::Proxy_Function_Base*>
            (&local_30.
              super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount,pPVar1);
  local_78._0_8_ = (type_info *)local_68;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"intercomm","");
  chaiscript::detail::Dispatch_Engine::validate_object_name(this,(string *)local_78);
  chaiscript::detail::Dispatch_Engine::add_function(this,&local_30,(string *)local_78);
  if ((type_info *)local_78._0_8_ != (type_info *)local_68) {
    operator_delete((void *)local_78._0_8_,CONCAT44(local_68._4_4_,local_68._0_4_) + 1);
  }
  if (local_30.
      super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_30.
               super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  chaiscript::fun<int,henson::ProcMap,std::__cxx11::string_const&>
            ((offset_in_ProcMap_to_subr)&local_90);
  local_78._0_8_ = (type_info *)local_68;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"size","");
  chaiscript::detail::Dispatch_Engine::validate_object_name(this,(string *)local_78);
  chaiscript::detail::Dispatch_Engine::add_function
            (this,(Proxy_Function *)&local_90,(string *)local_78);
  if ((type_info *)local_78._0_8_ != (type_info *)local_68) {
    operator_delete((void *)local_78._0_8_,CONCAT44(local_68._4_4_,local_68._0_4_) + 1);
  }
  if (local_90.super__Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>.
      _M_impl.super__Vector_impl_data._M_finish != (pointer)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_90.
               super__Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>.
               _M_impl.super__Vector_impl_data._M_finish);
  }
  return;
}

Assistant:

void chai_procs(chaiscript::ChaiScript& chai)
{
    // ProcMap
    chai.add(chaiscript::fun([]() { return proc_map; }),                    "ProcMap");
    chai.add(chaiscript::fun(&h::ProcMap::group),                           "group");
    chai.add(chaiscript::fun(&h::ProcMap::color),                           "color");
    chai.add(chaiscript::fun(&h::ProcMap::world_rank),                      "world_rank");
    chai.add(chaiscript::fun(&h::ProcMap::local_rank),                      "local_rank");
    chai.add(chaiscript::fun([](h::ProcMap* pm, std::string to)
                             { pm->intercomm(to); }),                       "intercomm");
    chai.add(chaiscript::fun(&h::ProcMap::size),                            "size");
}